

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brotli.c
# Opt level: O3

void PrintFileProcessingProgress(Context *context)

{
  char *pcVar1;
  
  pcVar1 = "con";
  if (context->current_input_path != (char *)0x0) {
    pcVar1 = context->current_input_path;
  }
  fprintf(_stderr,"[%s]: ",pcVar1);
  PrintBytes(context->total_in);
  fwrite(" -> ",4,1,_stderr);
  PrintBytes(context->total_out);
  return;
}

Assistant:

static void PrintFileProcessingProgress(Context* context) {
  fprintf(stderr, "[%s]: ", PrintablePath(context->current_input_path));
  PrintBytes(context->total_in);
  fprintf(stderr, " -> ");
  PrintBytes(context->total_out);
}